

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_make_listen_socket_reuseable_port(int sock)

{
  int iVar1;
  undefined4 local_10;
  int local_c;
  int one;
  int sock_local;
  
  local_10 = 1;
  local_c = sock;
  iVar1 = setsockopt(sock,1,0xf,&local_10,4);
  return iVar1;
}

Assistant:

int
evutil_make_listen_socket_reuseable_port(evutil_socket_t sock)
{
#if defined __linux__ && defined(SO_REUSEPORT)
	int one = 1;
	/* REUSEPORT on Linux 3.9+ means, "Multiple servers (processes or
	 * threads) can bind to the same port if they each set the option. */
	return setsockopt(sock, SOL_SOCKET, SO_REUSEPORT, (void*) &one,
	    (ev_socklen_t)sizeof(one));
#else
	return 0;
#endif
}